

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O1

void luaD_call(lua_State *L,StkId func,int nResults)

{
  byte *pbVar1;
  uint uVar2;
  CallInfo *ci;
  StkId local_20;
  
  uVar2 = L->nCcalls + 1;
  L->nCcalls = uVar2;
  if (199 < (uVar2 & 0xfff8)) {
    luaD_call_cold_1();
    func = local_20;
  }
  ci = luaD_precall(L,func,nResults);
  if (ci != (CallInfo *)0x0) {
    pbVar1 = (byte *)((long)&ci->callstatus + 2);
    *pbVar1 = *pbVar1 | 1;
    luaV_execute(L,ci);
  }
  L->nCcalls = L->nCcalls - 1;
  return;
}

Assistant:

void luaD_call (lua_State *L, StkId func, int nResults) {
  ccall(L, func, nResults, 1);
}